

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::BeginArray(VmaJsonWriter *this,bool singleLine)

{
  StackItem item;
  
  BeginValue(this,false);
  VmaStringBuilder::Add(this->m_SB,'[');
  item.type = COLLECTION_TYPE_ARRAY;
  item.valueCount = 0;
  item.singleLineMode = singleLine;
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::push_back
            (&this->m_Stack,&item);
  return;
}

Assistant:

void VmaJsonWriter::BeginArray(bool singleLine)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(false);
    m_SB.Add('[');

    StackItem item;
    item.type = COLLECTION_TYPE_ARRAY;
    item.valueCount = 0;
    item.singleLineMode = singleLine;
    m_Stack.push_back(item);
}